

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((kind == Identifier) || (kind == IntegerLiteral)) || (kind == Comma)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleEdgeDescriptor(TokenKind kind) {
    switch (kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::Identifier:
        case TokenKind::Comma:
            return true;
        default:
            return false;
    }
}